

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

bool __thiscall
QCommandLineParserPrivate::parseOptionValue
          (QCommandLineParserPrivate *this,QString *optionName,QString *argument,
          const_iterator *argumentIterator,const_iterator argsEnd)

{
  Span *pSVar1;
  QString *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Flags FVar6;
  qsizetype qVar7;
  QList<QString> *pQVar8;
  ulong uVar9;
  bool bVar10;
  QCommandLineOption *this_00;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  const_iterator cVar11;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  mapped_type optionOffset;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar11 = QHash<QString,_long_long>::constFindImpl<QString>(&this->nameHash,optionName);
  bVar10 = true;
  if (cVar11.i.d == (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 && cVar11.i.bucket == 0)
  goto LAB_00125796;
  qVar7 = QString::indexOf(argument,(QChar)0x3d,0,CaseSensitive);
  pSVar1 = (cVar11.i.d)->spans;
  uVar9 = cVar11.i.bucket >> 7;
  optionOffset = *(mapped_type *)
                  (pSVar1[uVar9].entries[pSVar1[uVar9].offsets[(uint)cVar11.i.bucket & 0x7f]].
                   storage.data + 0x18);
  this_00 = (this->commandLineOptionList).d.ptr + optionOffset;
  FVar6 = QCommandLineOption::flags(this_00);
  if (((uint)FVar6.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
             super_QFlagsStorage<QCommandLineOption::Flag>.i & 4) == 0) {
    QCommandLineOption::valueName((QString *)&local_58,this_00);
    qVar5 = local_58.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (qVar5 == 0) {
      if (qVar7 == -1) goto LAB_00125796;
      QCommandLineParser::tr((QString *)&local_70,"Unexpected value after \'%1\'.",(char *)0x0,-1);
      this_01 = &local_88;
      QString::left((QString *)this_01,argument,qVar7);
      QString::arg<QString,_true>
                ((QString *)&local_58,(QString *)&local_70,(QString *)this_01,0,(QChar)0x20);
      pDVar3 = (this->errorText).d.d;
      pcVar4 = (this->errorText).d.ptr;
      (this->errorText).d.d = local_58.d;
      (this->errorText).d.ptr = local_58.ptr;
      qVar7 = (this->errorText).d.size;
      (this->errorText).d.size = local_58.size;
      local_58.d = pDVar3;
      local_58.ptr = pcVar4;
      local_58.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      if (qVar7 != -1) {
        pQVar8 = QHash<long_long,_QList<QString>_>::operator[]
                           (&this->optionValuesHash,&optionOffset);
        QString::mid((QString *)&local_58,argument,qVar7 + 1,-1);
        QList<QString>::emplaceBack<QString>(pQVar8,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        goto LAB_00125796;
      }
      pQVar2 = argumentIterator->i;
      argumentIterator->i = pQVar2 + 1;
      if (pQVar2 + 1 != argsEnd.i) {
        pQVar8 = QHash<long_long,_QList<QString>_>::operator[]
                           (&this->optionValuesHash,&optionOffset);
        QList<QString>::emplaceBack<QString_const&>(pQVar8,argumentIterator->i);
        goto LAB_00125796;
      }
      QCommandLineParser::tr((QString *)&local_70,"Missing value after \'%1\'.",(char *)0x0,-1);
      this_01 = &local_58;
      QString::arg<QString,_true>((QString *)this_01,(QString *)&local_70,argument,0,(QChar)0x20);
      pDVar3 = (this->errorText).d.d;
      pcVar4 = (this->errorText).d.ptr;
      (this->errorText).d.d = local_58.d;
      (this->errorText).d.ptr = local_58.ptr;
      qVar7 = (this->errorText).d.size;
      (this->errorText).d.size = local_58.size;
      local_58.d = pDVar3;
      local_58.ptr = pcVar4;
      local_58.size = qVar7;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  else {
    argumentIterator->i = (QString *)argsEnd;
  }
  bVar10 = SUB41(((uint)FVar6.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                        super_QFlagsStorage<QCommandLineOption::Flag>.i & 4) >> 2,0);
LAB_00125796:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParserPrivate::parseOptionValue(const QString &optionName, const QString &argument,
                                                 QStringList::const_iterator *argumentIterator, QStringList::const_iterator argsEnd)
{
    const QLatin1Char assignChar('=');
    const NameHash_t::const_iterator nameHashIt = nameHash.constFind(optionName);
    if (nameHashIt != nameHash.constEnd()) {
        const qsizetype assignPos = argument.indexOf(assignChar);
        const NameHash_t::mapped_type optionOffset = *nameHashIt;
        const QCommandLineOption &option = commandLineOptionList.at(optionOffset);
        if (option.flags() & QCommandLineOption::IgnoreOptionsAfter) {
            *argumentIterator = argsEnd;
            return true;
        }
        const bool withValue = !option.valueName().isEmpty();
        if (withValue) {
            if (assignPos == -1) {
                ++(*argumentIterator);
                if (*argumentIterator == argsEnd) {
                    errorText = QCommandLineParser::tr("Missing value after '%1'.").arg(argument);
                    return false;
                }
                optionValuesHash[optionOffset].append(*(*argumentIterator));
            } else {
                optionValuesHash[optionOffset].append(argument.mid(assignPos + 1));
            }
        } else {
            if (assignPos != -1) {
                errorText = QCommandLineParser::tr("Unexpected value after '%1'.").arg(argument.left(assignPos));
                return false;
            }
        }
    }
    return true;
}